

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

void nifti_swap_8bytes(size_t n,void *ar)

{
  uchar uVar1;
  uchar *puStack_38;
  uchar tval;
  uchar *cp2;
  uchar *cp1;
  uchar *cp0;
  size_t ii;
  void *ar_local;
  size_t n_local;
  
  cp1 = (uchar *)ar;
  for (cp0 = (uchar *)0x0; cp0 < n; cp0 = cp0 + 1) {
    puStack_38 = cp1 + 7;
    for (cp2 = cp1; cp2 < puStack_38; cp2 = cp2 + 1) {
      uVar1 = *cp2;
      *cp2 = *puStack_38;
      *puStack_38 = uVar1;
      puStack_38 = puStack_38 + -1;
    }
    cp1 = cp1 + 8;
  }
  return;
}

Assistant:

void nifti_swap_8bytes( size_t n , void *ar )    /* 8 bytes at a time */
{
   register size_t ii ;
   unsigned char * cp0 = (unsigned char *)ar, * cp1, * cp2 ;
   register unsigned char tval ;

   for( ii=0 ; ii < n ; ii++ ){
       cp1 = cp0;  cp2 = cp0+7;
       while ( cp2 > cp1 )      /* unroll? */
       {
           tval = *cp1 ; *cp1 = *cp2 ; *cp2 = tval ;
           cp1++; cp2--;
       }
       cp0 += 8;
   }
   return ;
}